

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O1

void __thiscall Patch::Node::set_new_text(Node *this,optional<Text> *text)

{
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  *paVar2;
  pointer pcVar3;
  Text *__ptr_00;
  undefined8 uVar4;
  pointer __p;
  Text *pTVar5;
  pointer *__ptr;
  Text *local_18;
  
  if (text->is_some == true) {
    pTVar5 = (Text *)operator_new(0x38);
    paVar1 = &(pTVar5->content).field_2;
    (pTVar5->content)._M_dataplus = (_Alloc_hider)paVar1;
    pcVar3 = (text->value).content._M_dataplus._M_p;
    paVar2 = &(text->value).content.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)pcVar3 == paVar2) {
      uVar4 = *(undefined8 *)((long)&(text->value).content.field_2 + 8);
      paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
      *(undefined8 *)((long)&(pTVar5->content).field_2 + 8) = uVar4;
    }
    else {
      (pTVar5->content)._M_dataplus = (_Alloc_hider)pcVar3;
      (pTVar5->content).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    }
    (pTVar5->content)._M_string_length = (text->value).content._M_string_length;
    (text->value).content._M_dataplus._M_p = (pointer)paVar2;
    (text->value).content._M_string_length = 0;
    (text->value).content.field_2._M_local_buf[0] = L'\0';
    *(pointer *)
     &(pTVar5->line_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
         = (text->value).line_offsets.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(pTVar5->line_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
     + 8) = (text->value).line_offsets.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(pTVar5->line_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
     + 0x10) = (text->value).line_offsets.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    (text->value).line_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (text->value).line_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (text->value).line_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_18 = (Text *)0x0;
    __ptr_00 = (this->new_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
               super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
               super__Head_base<0UL,_Text_*,_false>._M_head_impl;
    (this->new_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
    super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.super__Head_base<0UL,_Text_*,_false>.
    _M_head_impl = pTVar5;
    if (__ptr_00 != (Text *)0x0) {
      std::default_delete<Text>::operator()((default_delete<Text> *)&this->new_text,__ptr_00);
    }
    if (local_18 != (Text *)0x0) {
      std::default_delete<Text>::operator()((default_delete<Text> *)&local_18,local_18);
    }
  }
  else {
    pTVar5 = (this->new_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
             super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
             super__Head_base<0UL,_Text_*,_false>._M_head_impl;
    (this->new_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
    super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.super__Head_base<0UL,_Text_*,_false>.
    _M_head_impl = (Text *)0x0;
    if (pTVar5 != (Text *)0x0) {
      std::default_delete<Text>::operator()((default_delete<Text> *)&this->new_text,pTVar5);
      return;
    }
  }
  return;
}

Assistant:

void set_new_text(optional<Text> &&text) {
    if (text) {
      new_text = unique_ptr<Text>{new Text{move(*text)}};
    } else {
      new_text = nullptr;
    }
  }